

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O2

size_t btokBAuthT_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = n * 0x10;
  sVar1 = ecpIsOnA_deep(n,f_deep);
  sVar1 = utilMax(2,f_deep,sVar1);
  uVar9 = 0x40;
  if (0x40 < uVar8) {
    uVar9 = uVar8;
  }
  sVar2 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar3 = beltHash_keep();
  sVar4 = beltKRP_keep();
  sVar5 = beltMAC_keep();
  sVar2 = utilMax(5,f_deep,sVar2,sVar3,sVar4,sVar5);
  sVar3 = beltHash_keep();
  sVar4 = beltMAC_keep();
  sVar5 = beltCFB_keep();
  sVar6 = ecpIsOnA_deep(n,f_deep);
  sVar7 = ecAddMulA_deep(n,ec_d,ec_deep,2,n,(n >> 1) + 1);
  sVar3 = utilMax(6,sVar3,sVar4,sVar5,f_deep,sVar6,sVar7);
  sVar1 = utilMax(3,sVar1 + uVar8,uVar9 + sVar2,sVar3 + (n * 3 + (n >> 1)) * 8 + 8);
  return sVar1;
}

Assistant:

static size_t btokBAuthT_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return utilMax(3,
		btokBAuthTStart_deep(n, f_deep, ec_d, ec_deep),
		btokBAuthTStep3_deep(n, f_deep, ec_d, ec_deep),
		btokBAuthTStep5_deep(n, f_deep, ec_d, ec_deep));
}